

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForwardTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  ForwardTypedefDeclarationSyntax *pFVar25;
  long lVar26;
  
  pFVar25 = (ForwardTypedefDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForwardTypedefDeclarationSyntax *)this->endPtr < pFVar25 + 1) {
    pFVar25 = (ForwardTypedefDeclarationSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pFVar25 + 1);
  }
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar21 = args_4->kind;
  uVar22 = args_4->field_0x2;
  NVar23.raw = (args_4->numFlags).raw;
  uVar24 = args_4->rawLen;
  pIVar6 = args_4->info;
  (pFVar25->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pFVar25->super_MemberSyntax).super_SyntaxNode.kind = ForwardTypedefDeclaration;
  SVar7 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar7;
  *(undefined4 *)
   &(pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar8
  ;
  (pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pFVar25->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pFVar25->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pFVar25->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pFVar25;
  sVar3 = (pFVar25->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pFVar25->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar26 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar26) = pFVar25;
      lVar26 = lVar26 + 8;
    } while (sVar3 << 3 != lVar26);
  }
  (pFVar25->typedefKeyword).kind = TVar9;
  (pFVar25->typedefKeyword).field_0x2 = uVar10;
  (pFVar25->typedefKeyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pFVar25->typedefKeyword).rawLen = uVar12;
  (pFVar25->typedefKeyword).info = pIVar1;
  (pFVar25->keyword).kind = TVar13;
  (pFVar25->keyword).field_0x2 = uVar14;
  (pFVar25->keyword).numFlags = (NumericTokenFlags)NVar15.raw;
  (pFVar25->keyword).rawLen = uVar16;
  (pFVar25->keyword).info = pIVar2;
  (pFVar25->name).kind = TVar17;
  (pFVar25->name).field_0x2 = uVar18;
  (pFVar25->name).numFlags = (NumericTokenFlags)NVar19.raw;
  (pFVar25->name).rawLen = uVar20;
  (pFVar25->name).info = pIVar5;
  (pFVar25->semi).kind = TVar21;
  (pFVar25->semi).field_0x2 = uVar22;
  (pFVar25->semi).numFlags = (NumericTokenFlags)NVar23.raw;
  (pFVar25->semi).rawLen = uVar24;
  (pFVar25->semi).info = pIVar6;
  return pFVar25;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }